

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.h
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetSingletonInstanceUnchecked
          (DictionaryTypeHandlerBase<unsigned_short> *this,
          RecyclerWeakReference<Js::DynamicObject> *instance)

{
  code *pcVar1;
  bool bVar2;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar3;
  undefined4 *puVar4;
  RecyclerWeakReference<Js::DynamicObject> *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryTypeHandler.h"
                                ,0xbd,"(!GetIsShared())","!GetIsShared()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&this->singletonInstance);
  if (*ppRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryTypeHandler.h"
                                ,0xbe,"(this->singletonInstance == nullptr)",
                                "this->singletonInstance == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator=
            (&this->singletonInstance,instance);
  return;
}

Assistant:

virtual void SetSingletonInstanceUnchecked(RecyclerWeakReference<DynamicObject>* instance) override
        {
            Assert(!GetIsShared());
            Assert(this->singletonInstance == nullptr);
            this->singletonInstance = instance;
        }